

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,_true>_>_>
::intersect(BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  Collider CVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  int iVar20;
  Scene *pSVar21;
  long lVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  byte *pbVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  Scene *pSVar35;
  Scene *pSVar36;
  ulong uVar37;
  float fVar38;
  float fVar66;
  float fVar67;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar68;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar84;
  float fVar85;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  RefCount RVar79;
  float fVar86;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  float fVar98;
  float fVar99;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar91;
  float fVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar106;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  float fVar119;
  float fVar120;
  undefined1 auVar118 [16];
  float fVar121;
  float fVar122;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  uint uVar130;
  float fVar131;
  float fVar132;
  float fVar138;
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar143;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar144;
  uint uVar145;
  float fVar149;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [16];
  uint uVar150;
  undefined1 auVar148 [16];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined4 uVar158;
  float fVar159;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar165 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_132c;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  float fStack_1310;
  float fStack_130c;
  undefined1 local_1308 [8];
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  long local_12d8;
  float fStack_12d0;
  float fStack_12cc;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  ulong local_12b8;
  Intersectors *local_12b0;
  RayHit *local_12a8;
  ulong local_12a0;
  int *local_1298;
  byte *local_1290;
  uint *local_1288;
  Intersectors *local_1280;
  float *local_1278;
  undefined4 local_1270;
  float local_1268;
  undefined4 local_1264;
  undefined4 local_1260;
  undefined4 local_125c;
  undefined4 local_1258;
  undefined4 local_1254;
  uint local_1250;
  uint local_124c;
  uint local_1248;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined1 local_11e8 [12];
  float fStack_11dc;
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  long local_10a0;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined1 local_f78 [3912];
  undefined1 auVar147 [16];
  
  if (*(_func_int ***)(*(long *)this + 0x70) != (_func_int **)0x8) {
    pSVar35 = (Scene *)(local_f78 + 0x10);
    local_f78._0_8_ = *(_func_int ***)(*(long *)this + 0x70);
    local_f78._8_4_ = 0;
    fVar86 = *(float *)&This->ptr;
    fVar152 = *(float *)((long)&This->ptr + 4);
    fVar38 = *(float *)&This->leafIntersector;
    fVar66 = *(float *)((long)&This->leafIntersector + 4);
    CVar6 = This->collider;
    fVar68 = *(float *)&(This->intersector1).intersect;
    fVar100 = 0.0;
    if (0.0 <= fVar68) {
      fVar100 = fVar68;
    }
    auVar134._4_4_ = -(uint)(ABS(CVar6.collide._4_4_) < 1e-18);
    auVar134._0_4_ = -(uint)(ABS(CVar6.collide._0_4_) < 1e-18);
    auVar134._8_4_ = -(uint)(ABS(CVar6.name._0_4_) < 1e-18);
    auVar134._12_4_ = -(uint)(ABS(CVar6.name._4_4_) < 1e-18);
    fVar68 = 0.0;
    if (0.0 <= fVar66) {
      fVar68 = fVar66;
    }
    auVar133 = divps(_DAT_01f46a60,(undefined1  [16])CVar6);
    auVar134 = blendvps(auVar133,_DAT_01f76a70,auVar134);
    fVar144 = auVar134._0_4_ * 0.99999964;
    fVar149 = auVar134._4_4_ * 0.99999964;
    fVar151 = auVar134._8_4_ * 0.99999964;
    fVar131 = auVar134._0_4_ * 1.0000004;
    fVar138 = auVar134._4_4_ * 1.0000004;
    fVar141 = auVar134._8_4_ * 1.0000004;
    uVar34 = (ulong)(fVar144 < 0.0) << 4;
    uVar32 = (ulong)(fVar149 < 0.0) << 4 | 0x20;
    uVar33 = (ulong)(fVar151 < 0.0) << 4 | 0x40;
    uVar30 = uVar34 ^ 0x10;
    auVar133._4_4_ = fVar100;
    auVar133._0_4_ = fVar100;
    auVar133._8_4_ = fVar100;
    auVar133._12_4_ = fVar100;
    local_1068 = mm_lookupmask_ps._0_8_;
    uStack_1060 = mm_lookupmask_ps._8_8_;
    local_1078 = mm_lookupmask_ps._240_8_;
    uStack_1070 = mm_lookupmask_ps._248_8_;
    local_12a8 = ray;
    local_12b0 = This;
    local_12b8 = uVar34;
    local_12a0 = uVar30;
    local_fe8 = fVar38;
    fStack_fe4 = fVar38;
    fStack_fe0 = fVar38;
    fStack_fdc = fVar38;
    local_ff8 = fVar68;
    fStack_ff4 = fVar68;
    fStack_ff0 = fVar68;
    fStack_fec = fVar68;
    local_1008 = fVar141;
    fStack_1004 = fVar141;
    fStack_1000 = fVar141;
    fStack_ffc = fVar141;
    local_1018 = fVar151;
    fStack_1014 = fVar151;
    fStack_1010 = fVar151;
    fStack_100c = fVar151;
    local_1028 = fVar86;
    fStack_1024 = fVar86;
    fStack_1020 = fVar86;
    fStack_101c = fVar86;
    local_1038 = fVar152;
    fStack_1034 = fVar152;
    fStack_1030 = fVar152;
    fStack_102c = fVar152;
    local_1048 = fVar144;
    fStack_1044 = fVar144;
    fStack_1040 = fVar144;
    fStack_103c = fVar144;
    local_1058 = fVar149;
    fStack_1054 = fVar149;
    fStack_1050 = fVar149;
    fStack_104c = fVar149;
    local_1088 = fVar131;
    fStack_1084 = fVar131;
    fStack_1080 = fVar131;
    fStack_107c = fVar131;
    local_1098 = fVar138;
    fStack_1094 = fVar138;
    fStack_1090 = fVar138;
    fStack_108c = fVar138;
    fVar100 = fVar68;
    fVar66 = fVar68;
    fVar67 = fVar68;
    fVar74 = fVar152;
    fVar84 = fVar152;
    fVar85 = fVar152;
    fVar87 = fVar131;
    fVar98 = fVar131;
    fVar99 = fVar131;
    fVar106 = fVar138;
    fVar117 = fVar138;
    fVar119 = fVar138;
    fVar120 = fVar38;
    fVar121 = fVar38;
    fVar122 = fVar38;
    fVar125 = fVar141;
    fVar126 = fVar141;
    fVar127 = fVar141;
    fVar128 = fVar151;
    fVar129 = fVar151;
    fVar132 = fVar151;
    fVar139 = fVar86;
    fVar140 = fVar86;
    fVar142 = fVar86;
    fVar143 = fVar144;
    fVar153 = fVar144;
    fVar156 = fVar144;
    fVar157 = fVar149;
    fVar159 = fVar149;
    fVar162 = fVar149;
LAB_0069289c:
    if (pSVar35 != (Scene *)local_f78) {
      fVar163 = *(float *)&pSVar35[-1].world.numMBPoints;
      pSVar35 = (Scene *)&pSVar35[-1].world.numPoints;
      if (fVar163 < *(float *)&(This->intersector1).intersect ||
          fVar163 == *(float *)&(This->intersector1).intersect) {
        pSVar21 = (Scene *)local_f78;
        pSVar36 = *(Scene **)pSVar35;
        while (((ulong)pSVar36 & 8) == 0) {
          pfVar1 = (float *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper + uVar34);
          auVar108._0_4_ = (*pfVar1 - fVar86) * fVar144;
          auVar108._4_4_ = (pfVar1[1] - fVar139) * fVar143;
          auVar108._8_4_ = (pfVar1[2] - fVar140) * fVar153;
          auVar108._12_4_ = (pfVar1[3] - fVar142) * fVar156;
          pfVar1 = (float *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper + uVar32);
          auVar114._0_4_ = (*pfVar1 - fVar152) * fVar149;
          auVar114._4_4_ = (pfVar1[1] - fVar74) * fVar157;
          auVar114._8_4_ = (pfVar1[2] - fVar84) * fVar159;
          auVar114._12_4_ = (pfVar1[3] - fVar85) * fVar162;
          auVar134 = maxps(auVar108,auVar114);
          pfVar1 = (float *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper + uVar33);
          auVar75._0_4_ = (*pfVar1 - fVar38) * fVar151;
          auVar75._4_4_ = (pfVar1[1] - fVar120) * fVar128;
          auVar75._8_4_ = (pfVar1[2] - fVar121) * fVar129;
          auVar75._12_4_ = (pfVar1[3] - fVar122) * fVar132;
          auVar76._4_4_ = fVar100;
          auVar76._0_4_ = fVar68;
          auVar76._8_4_ = fVar66;
          auVar76._12_4_ = fVar67;
          auVar76 = maxps(auVar75,auVar76);
          _local_11e8 = maxps(auVar134,auVar76);
          pfVar1 = (float *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper + uVar30);
          auVar77._0_4_ = (*pfVar1 - fVar86) * fVar131;
          auVar77._4_4_ = (pfVar1[1] - fVar139) * fVar87;
          auVar77._8_4_ = (pfVar1[2] - fVar140) * fVar98;
          auVar77._12_4_ = (pfVar1[3] - fVar142) * fVar99;
          pfVar1 = (float *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper + (uVar32 ^ 0x10));
          auVar88._0_4_ = (*pfVar1 - fVar152) * fVar138;
          auVar88._4_4_ = (pfVar1[1] - fVar74) * fVar106;
          auVar88._8_4_ = (pfVar1[2] - fVar84) * fVar117;
          auVar88._12_4_ = (pfVar1[3] - fVar85) * fVar119;
          auVar134 = minps(auVar77,auVar88);
          pfVar1 = (float *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper + (uVar33 ^ 0x10));
          auVar89._0_4_ = (*pfVar1 - fVar38) * fVar141;
          auVar89._4_4_ = (pfVar1[1] - fVar120) * fVar125;
          auVar89._8_4_ = (pfVar1[2] - fVar121) * fVar126;
          auVar89._12_4_ = (pfVar1[3] - fVar122) * fVar127;
          auVar76 = minps(auVar89,auVar133);
          auVar134 = minps(auVar134,auVar76);
          auVar109._4_4_ = -(uint)(local_11e8._4_4_ <= auVar134._4_4_);
          auVar109._0_4_ = -(uint)(local_11e8._0_4_ <= auVar134._0_4_);
          auVar109._8_4_ = -(uint)(local_11e8._8_4_ <= auVar134._8_4_);
          auVar109._12_4_ = -(uint)(local_11e8._12_4_ <= auVar134._12_4_);
          uVar19 = movmskps((int)pSVar21,auVar109);
          if (uVar19 == 0) goto LAB_0069289c;
          uVar19 = uVar19 & 0xff;
          uVar37 = (ulong)pSVar36 & 0xfffffffffffffff0;
          lVar31 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          pSVar21 = *(Scene **)(uVar37 + lVar31 * 8);
          uVar19 = uVar19 - 1 & uVar19;
          context = (RayQueryContext *)pSVar35;
          pSVar36 = pSVar21;
          if (uVar19 != 0) {
            uVar145 = *(uint *)(local_11e8 + lVar31 * 4);
            lVar31 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            pSVar36 = *(Scene **)(uVar37 + lVar31 * 8);
            uVar150 = *(uint *)(local_11e8 + lVar31 * 4);
            uVar19 = uVar19 - 1 & uVar19;
            if (uVar19 == 0) {
              context = (RayQueryContext *)
                        &(pSVar35->super_AccelN).super_Accel.super_AccelData.bounds;
              if (uVar145 < uVar150) {
                (pSVar35->super_AccelN).super_Accel.super_AccelData.super_RefCount._vptr_RefCount =
                     (_func_int **)pSVar36;
                *(uint *)&(pSVar35->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                          refCounter.super___atomic_base<unsigned_long>._M_i = uVar150;
                pSVar35 = (Scene *)context;
                pSVar36 = pSVar21;
              }
              else {
                (pSVar35->super_AccelN).super_Accel.super_AccelData.super_RefCount._vptr_RefCount =
                     (_func_int **)pSVar21;
                *(uint *)&(pSVar35->super_AccelN).super_Accel.super_AccelData.super_RefCount.
                          refCounter.super___atomic_base<unsigned_long>._M_i = uVar145;
                pSVar21 = pSVar36;
                pSVar35 = (Scene *)context;
              }
            }
            else {
              auVar78._8_4_ = uVar145;
              auVar78._0_8_ = pSVar21;
              auVar78._12_4_ = 0;
              auVar101._8_4_ = uVar150;
              auVar101._0_8_ = pSVar36;
              auVar101._12_4_ = 0;
              lVar31 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              uVar23 = *(undefined8 *)(uVar37 + lVar31 * 8);
              iVar20 = *(int *)(local_11e8 + lVar31 * 4);
              auVar90._8_4_ = iVar20;
              auVar90._0_8_ = uVar23;
              auVar90._12_4_ = 0;
              auVar39._8_4_ = -(uint)((int)uVar145 < (int)uVar150);
              uVar19 = uVar19 - 1 & uVar19;
              if (uVar19 == 0) {
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                auVar107._8_4_ = uVar150;
                auVar107._0_8_ = pSVar36;
                auVar107._12_4_ = 0;
                auVar108 = blendvps(auVar107,auVar78,auVar39);
                auVar134 = blendvps(auVar78,auVar101,auVar39);
                auVar40._8_4_ = -(uint)(auVar108._8_4_ < iVar20);
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar102._8_4_ = iVar20;
                auVar102._0_8_ = uVar23;
                auVar102._12_4_ = 0;
                auVar76 = blendvps(auVar102,auVar108,auVar40);
                auVar108 = blendvps(auVar108,auVar90,auVar40);
                auVar41._8_4_ = -(uint)(auVar134._8_4_ < auVar108._8_4_);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                aVar91 = (anon_union_16_2_47237d3f_for_Vec3fa_0)blendvps(auVar108,auVar134,auVar41);
                RVar79 = (RefCount)blendvps(auVar134,auVar108,auVar41);
                (pSVar35->super_AccelN).super_Accel.super_AccelData.super_RefCount = RVar79;
                (pSVar35->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.lower.field_0 =
                     aVar91;
                pSVar21 = auVar76._0_8_;
                pSVar35 = (Scene *)&(pSVar35->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds0.upper;
                context = (RayQueryContext *)pSVar35;
                pSVar36 = pSVar21;
              }
              else {
                lVar31 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                auVar42._4_4_ = auVar39._8_4_;
                auVar42._0_4_ = auVar39._8_4_;
                auVar42._8_4_ = auVar39._8_4_;
                auVar42._12_4_ = auVar39._8_4_;
                auVar109 = blendvps(auVar101,auVar78,auVar42);
                auVar134 = blendvps(auVar78,auVar101,auVar42);
                auVar113._8_4_ = *(int *)(local_11e8 + lVar31 * 4);
                auVar113._0_8_ = *(undefined8 *)(uVar37 + lVar31 * 8);
                auVar113._12_4_ = 0;
                auVar43._8_4_ = -(uint)(iVar20 < *(int *)(local_11e8 + lVar31 * 4));
                auVar43._4_4_ = auVar43._8_4_;
                auVar43._0_4_ = auVar43._8_4_;
                auVar43._12_4_ = auVar43._8_4_;
                auVar108 = blendvps(auVar113,auVar90,auVar43);
                auVar76 = blendvps(auVar90,auVar113,auVar43);
                auVar44._8_4_ = -(uint)(auVar134._8_4_ < auVar76._8_4_);
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar114 = blendvps(auVar76,auVar134,auVar44);
                RVar79 = (RefCount)blendvps(auVar134,auVar76,auVar44);
                auVar45._8_4_ = -(uint)(auVar109._8_4_ < auVar108._8_4_);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar134 = blendvps(auVar108,auVar109,auVar45);
                auVar76 = blendvps(auVar109,auVar108,auVar45);
                auVar46._8_4_ = -(uint)(auVar76._8_4_ < auVar114._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                aVar91 = (anon_union_16_2_47237d3f_for_Vec3fa_0)blendvps(auVar114,auVar76,auVar46);
                aVar110 = (anon_union_16_2_47237d3f_for_Vec3fa_0)blendvps(auVar76,auVar114,auVar46);
                (pSVar35->super_AccelN).super_Accel.super_AccelData.super_RefCount = RVar79;
                (pSVar35->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.lower.field_0 =
                     aVar110;
                (pSVar35->super_AccelN).super_Accel.super_AccelData.bounds.bounds0.upper.field_0 =
                     aVar91;
                pSVar21 = auVar134._0_8_;
                pSVar35 = (Scene *)&(pSVar35->super_AccelN).super_Accel.super_AccelData.bounds.
                                    bounds1;
                context = (RayQueryContext *)pSVar35;
                pSVar36 = pSVar21;
                fVar131 = local_1088;
                fVar87 = fStack_1084;
                fVar98 = fStack_1080;
                fVar99 = fStack_107c;
                fVar138 = local_1098;
                fVar106 = fStack_1094;
                fVar117 = fStack_1090;
                fVar119 = fStack_108c;
              }
            }
          }
        }
        lVar31 = (ulong)((uint)pSVar36 & 0xf) - 8;
        uVar37 = (ulong)pSVar36 & 0xfffffffffffffff0;
        for (local_10a0 = 0; local_10a0 != lVar31; local_10a0 = local_10a0 + 1) {
          lVar22 = local_10a0 * 0xe0;
          puVar5 = (undefined8 *)(uVar37 + 0xd0 + lVar22);
          local_11f8 = *puVar5;
          uStack_11f0 = puVar5[1];
          fVar68 = *(float *)&This->ptr;
          fVar100 = *(float *)((long)&This->ptr + 4);
          fVar86 = *(float *)&This->leafIntersector;
          pfVar1 = (float *)(uVar37 + lVar22);
          pfVar2 = (float *)(uVar37 + 0x10 + lVar22);
          pfVar3 = (float *)(uVar37 + 0x20 + lVar22);
          pfVar4 = (float *)(uVar37 + 0x30 + lVar22);
          local_1208 = *pfVar4;
          fStack_1204 = pfVar4[1];
          fStack_1200 = pfVar4[2];
          fStack_11fc = pfVar4[3];
          local_12e8._0_4_ = *pfVar1 - fVar68;
          local_12e8._4_4_ = pfVar1[1] - fVar68;
          fStack_12e0 = pfVar1[2] - fVar68;
          fStack_12dc = pfVar1[3] - fVar68;
          local_10b8 = *pfVar2 - fVar100;
          fStack_10b4 = pfVar2[1] - fVar100;
          fStack_10b0 = pfVar2[2] - fVar100;
          fStack_10ac = pfVar2[3] - fVar100;
          local_10c8 = *pfVar3 - fVar86;
          fStack_10c4 = pfVar3[1] - fVar86;
          fStack_10c0 = pfVar3[2] - fVar86;
          fStack_10bc = pfVar3[3] - fVar86;
          fVar132 = local_1208 - fVar68;
          fVar139 = fStack_1204 - fVar68;
          fVar142 = fStack_1200 - fVar68;
          fVar143 = fStack_11fc - fVar68;
          pfVar1 = (float *)(uVar37 + 0x40 + lVar22);
          local_1228 = *pfVar1;
          fStack_1224 = pfVar1[1];
          fStack_1220 = pfVar1[2];
          fStack_121c = pfVar1[3];
          fVar131 = local_1228 - fVar100;
          fVar106 = fStack_1224 - fVar100;
          fStack_12d0 = fStack_1220 - fVar100;
          fStack_12cc = fStack_121c - fVar100;
          pfVar1 = (float *)(uVar37 + 0x50 + lVar22);
          local_1218 = *pfVar1;
          fStack_1214 = pfVar1[1];
          fStack_1210 = pfVar1[2];
          fStack_120c = pfVar1[3];
          fVar121 = local_1218 - fVar86;
          fVar125 = fStack_1214 - fVar86;
          fVar127 = fStack_1210 - fVar86;
          fVar128 = fStack_120c - fVar86;
          pfVar1 = (float *)(uVar37 + 0x90 + lVar22);
          local_1328 = (byte *)*(undefined8 *)pfVar1;
          uStack_1320 = *(undefined8 *)(pfVar1 + 2);
          fVar38 = *pfVar1 - fVar68;
          fVar66 = pfVar1[1] - fVar68;
          fVar67 = pfVar1[2] - fVar68;
          fVar68 = pfVar1[3] - fVar68;
          pfVar1 = (float *)(uVar37 + 0xa0 + lVar22);
          local_12c8 = *(long *)pfVar1;
          uStack_12c0 = *(undefined8 *)(pfVar1 + 2);
          fVar87 = *pfVar1 - fVar100;
          fVar98 = pfVar1[1] - fVar100;
          fVar99 = pfVar1[2] - fVar100;
          fVar100 = pfVar1[3] - fVar100;
          pfVar1 = (float *)(uVar37 + 0xb0 + lVar22);
          fStack_1310 = pfVar1[2];
          fStack_130c = pfVar1[3];
          fVar74 = *pfVar1 - fVar86;
          fVar84 = pfVar1[1] - fVar86;
          fVar85 = fStack_1310 - fVar86;
          fVar86 = fStack_130c - fVar86;
          local_10d8._0_4_ = fVar38 - (float)local_12e8._0_4_;
          local_10d8._4_4_ = fVar66 - (float)local_12e8._4_4_;
          fStack_10d0 = fVar67 - fStack_12e0;
          fStack_10cc = fVar68 - fStack_12dc;
          local_10f8 = fVar87 - local_10b8;
          fStack_10f4 = fVar98 - fStack_10b4;
          fStack_10f0 = fVar99 - fStack_10b0;
          fStack_10ec = fVar100 - fStack_10ac;
          local_10e8 = fVar74 - local_10c8;
          fStack_10e4 = fVar84 - fStack_10c4;
          fStack_10e0 = fVar85 - fStack_10c0;
          fStack_10dc = fVar86 - fStack_10bc;
          fVar152 = *(float *)&(This->collider).collide;
          local_1308._4_4_ = *(float *)((long)&(This->collider).collide + 4);
          local_1238 = *(float *)&(This->collider).name;
          fVar151 = (local_10f8 * (local_10c8 + fVar74) - (local_10b8 + fVar87) * local_10e8) *
                    fVar152 + (((float)local_12e8._0_4_ + fVar38) * local_10e8 -
                              (local_10c8 + fVar74) * (float)local_10d8._0_4_) *
                              (float)local_1308._4_4_ +
                              ((float)local_10d8._0_4_ * (local_10b8 + fVar87) -
                              ((float)local_12e8._0_4_ + fVar38) * local_10f8) * local_1238;
          fVar140 = (fStack_10f4 * (fStack_10c4 + fVar84) - (fStack_10b4 + fVar98) * fStack_10e4) *
                    fVar152 + (((float)local_12e8._4_4_ + fVar66) * fStack_10e4 -
                              (fStack_10c4 + fVar84) * (float)local_10d8._4_4_) *
                              (float)local_1308._4_4_ +
                              ((float)local_10d8._4_4_ * (fStack_10b4 + fVar98) -
                              ((float)local_12e8._4_4_ + fVar66) * fStack_10f4) * local_1238;
          local_fa8._0_8_ = CONCAT44(fVar140,fVar151);
          local_fa8._8_4_ =
               (fStack_10f0 * (fStack_10c0 + fVar85) - (fStack_10b0 + fVar99) * fStack_10e0) *
               fVar152 + ((fStack_12e0 + fVar67) * fStack_10e0 -
                         (fStack_10c0 + fVar85) * fStack_10d0) * (float)local_1308._4_4_ +
                         (fStack_10d0 * (fStack_10b0 + fVar99) -
                         (fStack_12e0 + fVar67) * fStack_10f0) * local_1238;
          local_fa8._12_4_ =
               (fStack_10ec * (fStack_10bc + fVar86) - (fStack_10ac + fVar100) * fStack_10dc) *
               fVar152 + ((fStack_12dc + fVar68) * fStack_10dc -
                         (fStack_10bc + fVar86) * fStack_10cc) * (float)local_1308._4_4_ +
                         (fStack_10cc * (fStack_10ac + fVar100) -
                         (fStack_12dc + fVar68) * fStack_10ec) * local_1238;
          local_f88 = (float)local_12e8._0_4_ - fVar132;
          fStack_f84 = (float)local_12e8._4_4_ - fVar139;
          fStack_f80 = fStack_12e0 - fVar142;
          fStack_f7c = fStack_12dc - fVar143;
          fVar122 = local_10b8 - fVar131;
          fVar126 = fStack_10b4 - fVar106;
          fVar141 = fStack_10b0 - fStack_12d0;
          fVar129 = fStack_10ac - fStack_12cc;
          fVar117 = local_10c8 - fVar121;
          fVar119 = fStack_10c4 - fVar125;
          fVar138 = fStack_10c0 - fVar127;
          fVar120 = fStack_10bc - fVar128;
          local_f98 = (fVar122 * (local_10c8 + fVar121) - (local_10b8 + fVar131) * fVar117) *
                      fVar152 + (((float)local_12e8._0_4_ + fVar132) * fVar117 -
                                (local_10c8 + fVar121) * local_f88) * (float)local_1308._4_4_ +
                                (local_f88 * (local_10b8 + fVar131) -
                                ((float)local_12e8._0_4_ + fVar132) * fVar122) * local_1238;
          fStack_f94 = (fVar126 * (fStack_10c4 + fVar125) - (fStack_10b4 + fVar106) * fVar119) *
                       fVar152 + (((float)local_12e8._4_4_ + fVar139) * fVar119 -
                                 (fStack_10c4 + fVar125) * fStack_f84) * (float)local_1308._4_4_ +
                                 (fStack_f84 * (fStack_10b4 + fVar106) -
                                 ((float)local_12e8._4_4_ + fVar139) * fVar126) * local_1238;
          fStack_f90 = (fVar141 * (fStack_10c0 + fVar127) - (fStack_10b0 + fStack_12d0) * fVar138) *
                       fVar152 + ((fStack_12e0 + fVar142) * fVar138 -
                                 (fStack_10c0 + fVar127) * fStack_f80) * (float)local_1308._4_4_ +
                                 (fStack_f80 * (fStack_10b0 + fStack_12d0) -
                                 (fStack_12e0 + fVar142) * fVar141) * local_1238;
          fStack_f8c = (fVar129 * (fStack_10bc + fVar128) - (fStack_10ac + fStack_12cc) * fVar120) *
                       fVar152 + ((fStack_12dc + fVar143) * fVar120 -
                                 (fStack_10bc + fVar128) * fStack_f7c) * (float)local_1308._4_4_ +
                                 (fStack_f7c * (fStack_10ac + fStack_12cc) -
                                 (fStack_12dc + fVar143) * fVar129) * local_1238;
          fVar153 = fVar132 - fVar38;
          fVar156 = fVar139 - fVar66;
          fVar144 = fVar142 - fVar67;
          fVar157 = fVar143 - fVar68;
          fVar159 = fVar131 - fVar87;
          fVar162 = fVar106 - fVar98;
          fVar149 = fStack_12d0 - fVar99;
          fVar163 = fStack_12cc - fVar100;
          local_1108 = fVar121 - fVar74;
          fStack_1104 = fVar125 - fVar84;
          fStack_1100 = fVar127 - fVar85;
          fStack_10fc = fVar128 - fVar86;
          fStack_1234 = local_1238;
          fStack_1230 = local_1238;
          fStack_122c = local_1238;
          local_1308._0_4_ = local_1308._4_4_;
          fStack_1300 = (float)local_1308._4_4_;
          fStack_12fc = (float)local_1308._4_4_;
          fVar74 = (fVar159 * (fVar74 + fVar121) - (fVar87 + fVar131) * local_1108) * fVar152 +
                   ((fVar38 + fVar132) * local_1108 - (fVar74 + fVar121) * fVar153) *
                   (float)local_1308._4_4_ +
                   (fVar153 * (fVar87 + fVar131) - (fVar38 + fVar132) * fVar159) * local_1238;
          fVar66 = (fVar162 * (fVar84 + fVar125) - (fVar98 + fVar106) * fStack_1104) * fVar152 +
                   ((fVar66 + fVar139) * fStack_1104 - (fVar84 + fVar125) * fVar156) *
                   (float)local_1308._4_4_ +
                   (fVar156 * (fVar98 + fVar106) - (fVar66 + fVar139) * fVar162) * local_1238;
          fVar67 = (fVar149 * (fVar85 + fVar127) - (fVar99 + fStack_12d0) * fStack_1100) * fVar152 +
                   ((fVar67 + fVar142) * fStack_1100 - (fVar85 + fVar127) * fVar144) *
                   (float)local_1308._4_4_ +
                   (fVar144 * (fVar99 + fStack_12d0) - (fVar67 + fVar142) * fVar149) * local_1238;
          fVar84 = (fVar163 * (fVar86 + fVar128) - (fVar100 + fStack_12cc) * fStack_10fc) * fVar152
                   + ((fVar68 + fVar143) * fStack_10fc - (fVar86 + fVar128) * fVar157) *
                     (float)local_1308._4_4_ +
                     (fVar157 * (fVar100 + fStack_12cc) - (fVar68 + fVar143) * fVar163) * local_1238
          ;
          fVar68 = local_f98 + fVar151 + fVar74;
          fVar100 = fStack_f94 + fVar140 + fVar66;
          fVar86 = fStack_f90 + local_fa8._8_4_ + fVar67;
          fVar38 = fStack_f8c + local_fa8._12_4_ + fVar84;
          auVar47._8_4_ = local_fa8._8_4_;
          auVar47._0_8_ = local_fa8._0_8_;
          auVar47._12_4_ = local_fa8._12_4_;
          auVar9._4_4_ = fStack_f94;
          auVar9._0_4_ = local_f98;
          auVar9._8_4_ = fStack_f90;
          auVar9._12_4_ = fStack_f8c;
          auVar134 = minps(auVar47,auVar9);
          auVar17._4_4_ = fVar66;
          auVar17._0_4_ = fVar74;
          auVar17._8_4_ = fVar67;
          auVar17._12_4_ = fVar84;
          auVar134 = minps(auVar134,auVar17);
          auVar10._4_4_ = fStack_f94;
          auVar10._0_4_ = local_f98;
          auVar10._8_4_ = fStack_f90;
          auVar10._12_4_ = fStack_f8c;
          auVar133 = maxps(local_fa8,auVar10);
          auVar18._4_4_ = fVar66;
          auVar18._0_4_ = fVar74;
          auVar18._8_4_ = fVar67;
          auVar18._12_4_ = fVar84;
          auVar133 = maxps(auVar133,auVar18);
          fVar66 = ABS(fVar68) * 1.1920929e-07;
          fVar67 = ABS(fVar100) * 1.1920929e-07;
          fVar74 = ABS(fVar86) * 1.1920929e-07;
          fVar84 = ABS(fVar38) * 1.1920929e-07;
          auVar135._4_4_ = -(uint)(auVar133._4_4_ <= fVar67);
          auVar135._0_4_ = -(uint)(auVar133._0_4_ <= fVar66);
          auVar135._8_4_ = -(uint)(auVar133._8_4_ <= fVar74);
          auVar135._12_4_ = -(uint)(auVar133._12_4_ <= fVar84);
          auVar48._4_4_ = -(uint)(-fVar67 <= auVar134._4_4_);
          auVar48._0_4_ = -(uint)(-fVar66 <= auVar134._0_4_);
          auVar48._8_4_ = -(uint)(-fVar74 <= auVar134._8_4_);
          auVar48._12_4_ = -(uint)(-fVar84 <= auVar134._12_4_);
          auVar135 = auVar135 | auVar48;
          lVar29 = uVar37 + lVar22;
          iVar20 = movmskps((int)lVar22,auVar135);
          local_12d8 = lVar29;
          local_1318._0_4_ = (float)*(undefined8 *)pfVar1;
          local_1318._4_4_ = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
          if (iVar20 == 0) {
            uVar19 = 0;
          }
          else {
            local_fd8 = fVar68;
            fStack_fd4 = fVar100;
            fStack_fd0 = fVar86;
            fStack_fcc = fVar38;
            local_fc8 = fVar153;
            fStack_fc4 = fVar156;
            fStack_fc0 = fVar144;
            fStack_fbc = fVar157;
            local_fb8 = fVar159;
            fStack_fb4 = fVar162;
            fStack_fb0 = fVar149;
            fStack_fac = fVar163;
            auVar103._0_4_ = local_10f8 * fVar117 - fVar122 * local_10e8;
            auVar103._4_4_ = fStack_10f4 * fVar119 - fVar126 * fStack_10e4;
            auVar103._8_4_ = fStack_10f0 * fVar138 - fVar141 * fStack_10e0;
            auVar103._12_4_ = fStack_10ec * fVar120 - fVar129 * fStack_10dc;
            auVar123._0_4_ = fVar122 * local_1108 - fVar117 * fVar159;
            auVar123._4_4_ = fVar126 * fStack_1104 - fVar119 * fVar162;
            auVar123._8_4_ = fVar141 * fStack_1100 - fVar138 * fVar149;
            auVar123._12_4_ = fVar129 * fStack_10fc - fVar120 * fVar163;
            auVar49._4_4_ = -(uint)(ABS(fVar126 * fStack_10e4) < ABS(fVar119 * fVar162));
            auVar49._0_4_ = -(uint)(ABS(fVar122 * local_10e8) < ABS(fVar117 * fVar159));
            auVar49._8_4_ = -(uint)(ABS(fVar141 * fStack_10e0) < ABS(fVar138 * fVar149));
            auVar49._12_4_ = -(uint)(ABS(fVar129 * fStack_10dc) < ABS(fVar120 * fVar163));
            local_11b8 = blendvps(auVar123,auVar103,auVar49);
            auVar115._0_4_ = local_10e8 * local_f88 - fVar117 * (float)local_10d8._0_4_;
            auVar115._4_4_ = fStack_10e4 * fStack_f84 - fVar119 * (float)local_10d8._4_4_;
            auVar115._8_4_ = fStack_10e0 * fStack_f80 - fVar138 * fStack_10d0;
            auVar115._12_4_ = fStack_10dc * fStack_f7c - fVar120 * fStack_10cc;
            auVar118._0_4_ = fVar117 * fVar153 - local_f88 * local_1108;
            auVar118._4_4_ = fVar119 * fVar156 - fStack_f84 * fStack_1104;
            auVar118._8_4_ = fVar138 * fVar144 - fStack_f80 * fStack_1100;
            auVar118._12_4_ = fVar120 * fVar157 - fStack_f7c * fStack_10fc;
            auVar50._4_4_ =
                 -(uint)(ABS(fVar119 * (float)local_10d8._4_4_) < ABS(fStack_f84 * fStack_1104));
            auVar50._0_4_ =
                 -(uint)(ABS(fVar117 * (float)local_10d8._0_4_) < ABS(local_f88 * local_1108));
            auVar50._8_4_ = -(uint)(ABS(fVar138 * fStack_10d0) < ABS(fStack_f80 * fStack_1100));
            auVar50._12_4_ = -(uint)(ABS(fVar120 * fStack_10cc) < ABS(fStack_f7c * fStack_10fc));
            local_11a8 = blendvps(auVar118,auVar115,auVar50);
            auVar154._0_4_ = local_f88 * fVar159 - fVar122 * fVar153;
            auVar154._4_4_ = fStack_f84 * fVar162 - fVar126 * fVar156;
            auVar154._8_4_ = fStack_f80 * fVar149 - fVar141 * fVar144;
            auVar154._12_4_ = fStack_f7c * fVar163 - fVar129 * fVar157;
            auVar51._4_4_ = -(uint)(ABS(fStack_f84 * fStack_10f4) < ABS(fVar126 * fVar156));
            auVar51._0_4_ = -(uint)(ABS(local_f88 * local_10f8) < ABS(fVar122 * fVar153));
            auVar51._8_4_ = -(uint)(ABS(fStack_f80 * fStack_10f0) < ABS(fVar141 * fVar144));
            auVar51._12_4_ = -(uint)(ABS(fStack_f7c * fStack_10ec) < ABS(fVar129 * fVar157));
            auVar11._4_4_ = (float)local_10d8._4_4_ * fVar126 - fStack_f84 * fStack_10f4;
            auVar11._0_4_ = (float)local_10d8._0_4_ * fVar122 - local_f88 * local_10f8;
            auVar11._8_4_ = fStack_10d0 * fVar141 - fStack_f80 * fStack_10f0;
            auVar11._12_4_ = fStack_10cc * fVar129 - fStack_f7c * fStack_10ec;
            local_1198 = blendvps(auVar154,auVar11,auVar51);
            fVar66 = fVar152 * local_11b8._0_4_ +
                     (float)local_1308._4_4_ * local_11a8._0_4_ + local_1238 * local_1198._0_4_;
            fVar67 = fVar152 * local_11b8._4_4_ +
                     (float)local_1308._4_4_ * local_11a8._4_4_ + local_1238 * local_1198._4_4_;
            fVar74 = fVar152 * local_11b8._8_4_ +
                     (float)local_1308._4_4_ * local_11a8._8_4_ + local_1238 * local_1198._8_4_;
            fVar152 = fVar152 * local_11b8._12_4_ +
                      (float)local_1308._4_4_ * local_11a8._12_4_ + local_1238 * local_1198._12_4_;
            auVar146._0_4_ = fVar66 + fVar66;
            auVar146._4_4_ = fVar67 + fVar67;
            auVar146._8_4_ = fVar74 + fVar74;
            auVar146._12_4_ = fVar152 + fVar152;
            auVar52._0_4_ = local_10b8 * local_11a8._0_4_ + local_10c8 * local_1198._0_4_;
            auVar52._4_4_ = fStack_10b4 * local_11a8._4_4_ + fStack_10c4 * local_1198._4_4_;
            auVar52._8_4_ = fStack_10b0 * local_11a8._8_4_ + fStack_10c0 * local_1198._8_4_;
            auVar52._12_4_ = fStack_10ac * local_11a8._12_4_ + fStack_10bc * local_1198._12_4_;
            fVar152 = (float)local_12e8._0_4_ * local_11b8._0_4_ + auVar52._0_4_;
            fVar66 = (float)local_12e8._4_4_ * local_11b8._4_4_ + auVar52._4_4_;
            fVar67 = fStack_12e0 * local_11b8._8_4_ + auVar52._8_4_;
            fVar74 = fStack_12dc * local_11b8._12_4_ + auVar52._12_4_;
            auVar104._0_4_ = fVar152 + fVar152;
            auVar104._4_4_ = fVar66 + fVar66;
            auVar104._8_4_ = fVar67 + fVar67;
            auVar104._12_4_ = fVar74 + fVar74;
            auVar134 = rcpps(auVar52,auVar146);
            fVar152 = auVar134._0_4_;
            fVar66 = auVar134._4_4_;
            fVar67 = auVar134._8_4_;
            fVar74 = auVar134._12_4_;
            local_1308._0_4_ =
                 ((1.0 - auVar146._0_4_ * fVar152) * fVar152 + fVar152) * auVar104._0_4_;
            local_1308._4_4_ = ((1.0 - auVar146._4_4_ * fVar66) * fVar66 + fVar66) * auVar104._4_4_;
            fStack_1300 = ((1.0 - auVar146._8_4_ * fVar67) * fVar67 + fVar67) * auVar104._8_4_;
            fStack_12fc = ((1.0 - auVar146._12_4_ * fVar74) * fVar74 + fVar74) * auVar104._12_4_;
            auVar160._0_8_ = (This->intersector1).intersect;
            auVar160._8_8_ = (This->intersector1).occluded;
            fVar66 = (float)auVar160._0_8_;
            fVar152 = *(float *)((long)&This->leafIntersector + 4);
            uVar145 = -(uint)(auVar146._0_4_ != 0.0) & auVar135._0_4_ &
                      -(uint)((float)local_1308._0_4_ <= fVar66 &&
                             fVar152 <= (float)local_1308._0_4_);
            uVar150 = -(uint)(auVar146._4_4_ != 0.0) & auVar135._4_4_ &
                      -(uint)((float)local_1308._4_4_ <= fVar66 &&
                             fVar152 <= (float)local_1308._4_4_);
            auVar147._0_8_ = CONCAT44(uVar150,uVar145);
            auVar147._8_4_ =
                 -(uint)(auVar146._8_4_ != 0.0) & auVar135._8_4_ &
                 -(uint)(fStack_1300 <= fVar66 && fVar152 <= fStack_1300);
            auVar147._12_4_ =
                 -(uint)(auVar146._12_4_ != 0.0) & auVar135._12_4_ &
                 -(uint)(fStack_12fc <= fVar66 && fVar152 <= fStack_12fc);
            uVar19 = movmskps(iVar20,auVar147);
            if (uVar19 != 0) {
              local_11e8._8_4_ = local_fa8._8_4_;
              local_11e8._0_8_ = local_fa8._0_8_;
              fStack_11dc = local_fa8._12_4_;
              local_11d8._4_4_ = fStack_f94;
              local_11d8._0_4_ = local_f98;
              fStack_11d0 = fStack_f90;
              fStack_11cc = fStack_f8c;
              local_11c8._4_4_ = fVar100;
              local_11c8._0_4_ = fVar68;
              local_11c8._8_4_ = fVar86;
              local_11c8._12_4_ = fVar38;
              local_1188 = auVar147;
              local_1158._4_4_ = local_1308._4_4_;
              local_1158._0_4_ = local_1308._0_4_;
              fStack_1150 = fStack_1300;
              fStack_114c = fStack_12fc;
              local_1118._8_8_ = uStack_1060;
              local_1118._0_8_ = local_1068;
              local_12f8 = auVar147;
              auVar134 = rcpps(auVar104,local_11c8);
              fVar84 = auVar134._0_4_;
              fVar85 = auVar134._4_4_;
              fVar87 = auVar134._8_4_;
              fVar98 = auVar134._12_4_;
              fVar66 = (float)DAT_01f46a60;
              fVar67 = DAT_01f46a60._4_4_;
              fVar74 = DAT_01f46a60._12_4_;
              fVar152 = DAT_01f46a60._8_4_;
              fVar68 = (float)(-(uint)(1e-18 <= ABS(fVar68)) &
                              (uint)((fVar66 - fVar68 * fVar84) * fVar84 + fVar84));
              fVar100 = (float)(-(uint)(1e-18 <= ABS(fVar100)) &
                               (uint)((fVar67 - fVar100 * fVar85) * fVar85 + fVar85));
              fVar86 = (float)(-(uint)(1e-18 <= ABS(fVar86)) &
                              (uint)((fVar152 - fVar86 * fVar87) * fVar87 + fVar87));
              fVar38 = (float)(-(uint)(1e-18 <= ABS(fVar38)) &
                              (uint)((fVar74 - fVar38 * fVar98) * fVar98 + fVar98));
              auVar111._0_4_ = fVar151 * fVar68;
              auVar111._4_4_ = fVar140 * fVar100;
              auVar111._8_4_ = local_fa8._8_4_ * fVar86;
              auVar111._12_4_ = local_fa8._12_4_ * fVar38;
              auVar134 = minps(auVar111,_DAT_01f46a60);
              auVar164._0_4_ = fVar68 * local_f98;
              auVar164._4_4_ = fVar100 * fStack_f94;
              auVar164._8_4_ = fVar86 * fStack_f90;
              auVar164._12_4_ = fVar38 * fStack_f8c;
              auVar133 = minps(auVar164,_DAT_01f46a60);
              auVar80._0_4_ = fVar66 - auVar134._0_4_;
              auVar80._4_4_ = fVar67 - auVar134._4_4_;
              auVar80._8_4_ = fVar152 - auVar134._8_4_;
              auVar80._12_4_ = fVar74 - auVar134._12_4_;
              auVar92._0_4_ = fVar66 - auVar133._0_4_;
              auVar92._4_4_ = fVar67 - auVar133._4_4_;
              auVar92._8_4_ = fVar152 - auVar133._8_4_;
              auVar92._12_4_ = fVar74 - auVar133._12_4_;
              local_1178 = blendvps(auVar134,auVar80,local_1118);
              local_1168 = blendvps(auVar133,auVar92,local_1118);
              local_1148 = local_11b8;
              local_1138 = local_11a8;
              local_1128 = local_1198;
              auVar53._8_4_ = auVar147._8_4_;
              auVar53._0_8_ = auVar147._0_8_;
              auVar53._12_4_ = auVar147._12_4_;
              auVar12._4_4_ = local_1308._4_4_;
              auVar12._0_4_ = local_1308._0_4_;
              auVar12._8_4_ = fStack_1300;
              auVar12._12_4_ = fStack_12fc;
              auVar133 = blendvps(_DAT_01f45a30,auVar12,auVar53);
              auVar93._4_4_ = auVar133._0_4_;
              auVar93._0_4_ = auVar133._4_4_;
              auVar93._8_4_ = auVar133._12_4_;
              auVar93._12_4_ = auVar133._8_4_;
              auVar134 = minps(auVar93,auVar133);
              auVar54._0_8_ = auVar134._8_8_;
              auVar54._8_4_ = auVar134._0_4_;
              auVar54._12_4_ = auVar134._4_4_;
              auVar134 = minps(auVar54,auVar134);
              auVar55._0_8_ =
                   CONCAT44(-(uint)(auVar134._4_4_ == auVar133._4_4_) & uVar150,
                            -(uint)(auVar134._0_4_ == auVar133._0_4_) & uVar145);
              auVar55._8_4_ = -(uint)(auVar134._8_4_ == auVar133._8_4_) & auVar147._8_4_;
              auVar55._12_4_ = -(uint)(auVar134._12_4_ == auVar133._12_4_) & auVar147._12_4_;
              iVar20 = movmskps(uVar19,auVar55);
              if (iVar20 != 0) {
                auVar147._8_4_ = auVar55._8_4_;
                auVar147._0_8_ = auVar55._0_8_;
                auVar147._12_4_ = auVar55._12_4_;
              }
              uVar23 = extractps(auVar160,1);
              uVar24 = movmskps((int)context,auVar147);
              uVar30 = CONCAT44((int)((ulong)context >> 0x20),uVar24);
              lVar22 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              local_1318 = *(long *)&(ray->super_RayK<1>).org.field_0;
LAB_0069314f:
              local_1250 = *(uint *)(lVar29 + 0xc0 + lVar22 * 4);
              pbVar28 = (byte *)(ulong)local_1250;
              lVar29 = *(long *)(*(long *)(local_1318 + 0x1e8) + (long)pbVar28 * 8);
              if ((*(uint *)(lVar29 + 0x34) & (uint)uVar23) == 0) {
                *(undefined4 *)(local_12f8 + lVar22 * 4) = 0;
                lVar29 = local_12d8;
                goto LAB_006931a1;
              }
              local_1328 = *(byte **)&(ray->super_RayK<1>).dir.field_0;
              if (*(long *)(local_1328 + 0x10) == 0) {
                local_1288 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                if (*(long *)(lVar29 + 0x40) == 0) {
                  uVar24 = *(undefined4 *)(local_1178 + lVar22 * 4);
                  uVar25 = *(undefined4 *)(local_1168 + lVar22 * 4);
                  *(undefined4 *)&(This->intersector1).intersect =
                       *(undefined4 *)(local_1158 + lVar22 * 4);
                  *(undefined4 *)&(This->intersector1).pointQuery =
                       *(undefined4 *)(local_1148 + lVar22 * 4);
                  *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                       *(undefined4 *)(local_1138 + lVar22 * 4);
                  *(undefined4 *)&(This->intersector1).name =
                       *(undefined4 *)(local_1128 + lVar22 * 4);
                  *(undefined4 *)((long)&(This->intersector1).name + 4) = uVar24;
                  *(undefined4 *)&(This->intersector4).intersect = uVar25;
                  *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                       *(undefined4 *)((long)&local_11f8 + lVar22 * 4);
                  *(uint *)&(This->intersector4).occluded = local_1250;
                  context = (RayQueryContext *)(ulong)*local_1288;
                  *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1288;
                  uVar19 = local_1288[1];
                  *(uint *)&(This->intersector4).name = uVar19;
                  lVar29 = local_12d8;
LAB_006934b9:
                  local_1208 = *(float *)(lVar29 + 0x30);
                  fStack_1204 = *(float *)(lVar29 + 0x34);
                  fStack_1200 = *(float *)(lVar29 + 0x38);
                  fStack_11fc = *(float *)(lVar29 + 0x3c);
                  local_1228 = *(float *)(lVar29 + 0x40);
                  fStack_1224 = *(float *)(lVar29 + 0x44);
                  fStack_1220 = *(float *)(lVar29 + 0x48);
                  fStack_121c = *(float *)(lVar29 + 0x4c);
                  local_1218 = *(float *)(lVar29 + 0x50);
                  fStack_1214 = *(float *)(lVar29 + 0x54);
                  fStack_1210 = *(float *)(lVar29 + 0x58);
                  fStack_120c = *(float *)(lVar29 + 0x5c);
                  local_1328 = *(byte **)(lVar29 + 0x90);
                  uStack_1320 = *(undefined8 *)(lVar29 + 0x98);
                  local_12c8 = *(long *)(lVar29 + 0xa0);
                  uStack_12c0 = *(undefined8 *)(lVar29 + 0xa8);
                  local_1318._0_4_ = *(float *)(lVar29 + 0xb0);
                  local_1318._4_4_ = *(float *)(lVar29 + 0xb4);
                  fStack_1310 = *(float *)(lVar29 + 0xb8);
                  fStack_130c = *(float *)(lVar29 + 0xbc);
                  uVar30 = local_12a0;
                  goto LAB_006934ea;
                }
                _local_12e8 = auVar160;
              }
              else {
                _local_12e8 = auVar160;
                local_1288 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
              }
              local_1268 = *(float *)(local_1148 + lVar22 * 4);
              local_1264 = *(undefined4 *)(local_1138 + lVar22 * 4);
              local_1260 = *(undefined4 *)(local_1128 + lVar22 * 4);
              local_125c = *(undefined4 *)(local_1178 + lVar22 * 4);
              local_1258 = *(undefined4 *)(local_1168 + lVar22 * 4);
              local_1254 = *(undefined4 *)((long)&local_11f8 + lVar22 * 4);
              local_124c = *local_1288;
              local_1248 = local_1288[1];
              *(undefined4 *)&(This->intersector1).intersect =
                   *(undefined4 *)(local_1158 + lVar22 * 4);
              local_132c = -1;
              local_1298 = &local_132c;
              pbVar28 = *(byte **)(lVar29 + 0x18);
              local_1290 = pbVar28;
              local_1280 = This;
              local_1278 = &local_1268;
              local_1270 = 1;
              fVar68 = (float)local_1308._0_4_;
              fVar100 = (float)local_1308._4_4_;
              fVar86 = fStack_1300;
              fVar152 = fStack_12fc;
              _local_12e8 = auVar160;
              if (*(code **)(lVar29 + 0x40) == (code *)0x0) {
LAB_00693341:
                if ((*(code **)(local_1328 + 0x10) != (code *)0x0) &&
                   (((*local_1328 & 2) != 0 || ((*(byte *)(lVar29 + 0x3e) & 0x40) != 0)))) {
                  (**(code **)(local_1328 + 0x10))(&local_1298);
                  pbVar28 = local_1328;
                  This = local_12b0;
                  ray = local_12a8;
                  uVar34 = local_12b8;
                  fVar68 = (float)local_1308._0_4_;
                  fVar100 = (float)local_1308._4_4_;
                  fVar86 = fStack_1300;
                  fVar152 = fStack_12fc;
                  if (*local_1298 == 0) goto LAB_00693400;
                }
                *(float *)&(local_1280->intersector1).pointQuery = *local_1278;
                *(float *)((long)&(local_1280->intersector1).pointQuery + 4) = local_1278[1];
                *(float *)&(local_1280->intersector1).name = local_1278[2];
                *(float *)((long)&(local_1280->intersector1).name + 4) = local_1278[3];
                *(float *)&(local_1280->intersector4).intersect = local_1278[4];
                *(float *)((long)&(local_1280->intersector4).intersect + 4) = local_1278[5];
                *(float *)&(local_1280->intersector4).occluded = local_1278[6];
                *(float *)((long)&(local_1280->intersector4).occluded + 4) = local_1278[7];
                pbVar28 = (byte *)(ulong)(uint)local_1278[8];
                *(float *)&(local_1280->intersector4).name = local_1278[8];
                local_1308._0_4_ = fVar68;
                local_1308._4_4_ = fVar100;
                fStack_1300 = fVar86;
                fStack_12fc = fVar152;
              }
              else {
                local_12c8 = lVar31;
                (**(code **)(lVar29 + 0x40))(&local_1298);
                This = local_12b0;
                lVar31 = local_12c8;
                ray = local_12a8;
                uVar34 = local_12b8;
                fVar68 = (float)local_1308._0_4_;
                fVar100 = (float)local_1308._4_4_;
                fVar86 = fStack_1300;
                fVar152 = fStack_12fc;
                if (*local_1298 != 0) goto LAB_00693341;
LAB_00693400:
                *(undefined4 *)&(local_12b0->intersector1).intersect = local_12e8._0_4_;
                This = local_12b0;
                ray = local_12a8;
                uVar34 = local_12b8;
              }
              lVar29 = local_12d8;
              *(undefined4 *)(local_12f8 + lVar22 * 4) = 0;
              auVar160._0_8_ = (This->intersector1).intersect;
              auVar160._8_8_ = (This->intersector1).occluded;
              fVar68 = (float)auVar160._0_8_;
              local_12f8._0_4_ = -(uint)((float)local_1308._0_4_ <= fVar68) & local_12f8._0_4_;
              local_12f8._4_4_ = -(uint)((float)local_1308._4_4_ <= fVar68) & local_12f8._4_4_;
              local_12f8._8_4_ = -(uint)(fStack_1300 <= fVar68) & local_12f8._8_4_;
              local_12f8._12_4_ = -(uint)(fStack_12fc <= fVar68) & local_12f8._12_4_;
              uVar23 = extractps(auVar160,1);
LAB_006931a1:
              uVar19 = (uint)uVar23;
              uVar24 = (undefined4)((ulong)pbVar28 >> 0x20);
              iVar20 = movmskps((int)pbVar28,local_12f8);
              context = (RayQueryContext *)CONCAT44(uVar24,iVar20);
              if (iVar20 == 0) goto LAB_006934b9;
              auVar13._4_4_ = local_1308._4_4_;
              auVar13._0_4_ = local_1308._0_4_;
              auVar13._8_4_ = fStack_1300;
              auVar13._12_4_ = fStack_12fc;
              auVar133 = blendvps(_DAT_01f45a30,auVar13,local_12f8);
              auVar94._4_4_ = auVar133._0_4_;
              auVar94._0_4_ = auVar133._4_4_;
              auVar94._8_4_ = auVar133._12_4_;
              auVar94._12_4_ = auVar133._8_4_;
              auVar134 = minps(auVar94,auVar133);
              auVar69._0_8_ = auVar134._8_8_;
              auVar69._8_4_ = auVar134._0_4_;
              auVar69._12_4_ = auVar134._4_4_;
              auVar134 = minps(auVar69,auVar134);
              auVar70._0_8_ =
                   CONCAT44(-(uint)(auVar134._4_4_ == auVar133._4_4_) & local_12f8._4_4_,
                            -(uint)(auVar134._0_4_ == auVar133._0_4_) & local_12f8._0_4_);
              auVar70._8_4_ = -(uint)(auVar134._8_4_ == auVar133._8_4_) & local_12f8._8_4_;
              auVar70._12_4_ = -(uint)(auVar134._12_4_ == auVar133._12_4_) & local_12f8._12_4_;
              iVar20 = movmskps(iVar20,auVar70);
              auVar56 = local_12f8;
              if (iVar20 != 0) {
                auVar56._8_4_ = auVar70._8_4_;
                auVar56._0_8_ = auVar70._0_8_;
                auVar56._12_4_ = auVar70._12_4_;
              }
              uVar25 = movmskps(iVar20,auVar56);
              uVar30 = CONCAT44(uVar24,uVar25);
              lVar22 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              goto LAB_0069314f;
            }
          }
LAB_006934ea:
          fVar68 = *(float *)&This->ptr;
          fVar100 = *(float *)((long)&This->ptr + 4);
          fVar86 = *(float *)&This->leafIntersector;
          local_12e8._0_4_ = *(float *)(lVar29 + 0x60) - fVar68;
          local_12e8._4_4_ = *(float *)(lVar29 + 100) - fVar68;
          fStack_12e0 = *(float *)(lVar29 + 0x68) - fVar68;
          fStack_12dc = *(float *)(lVar29 + 0x6c) - fVar68;
          fVar87 = *(float *)(lVar29 + 0x70) - fVar100;
          fVar98 = *(float *)(lVar29 + 0x74) - fVar100;
          fVar99 = *(float *)(lVar29 + 0x78) - fVar100;
          fVar131 = *(float *)(lVar29 + 0x7c) - fVar100;
          fVar122 = *(float *)(lVar29 + 0x80) - fVar86;
          fVar125 = *(float *)(lVar29 + 0x84) - fVar86;
          fVar126 = *(float *)(lVar29 + 0x88) - fVar86;
          fVar127 = *(float *)(lVar29 + 0x8c) - fVar86;
          fVar106 = (float)local_1328 - fVar68;
          fVar119 = local_1328._4_4_ - fVar68;
          fVar120 = (float)uStack_1320 - fVar68;
          fVar121 = uStack_1320._4_4_ - fVar68;
          fVar153 = (float)local_12c8 - fVar100;
          fVar157 = local_12c8._4_4_ - fVar100;
          fVar149 = (float)uStack_12c0 - fVar100;
          fVar166 = uStack_12c0._4_4_ - fVar100;
          fVar67 = (float)local_1318 - fVar86;
          fVar74 = local_1318._4_4_ - fVar86;
          fVar84 = fStack_1310 - fVar86;
          fVar85 = fStack_130c - fVar86;
          fVar141 = local_1208 - fVar68;
          fVar128 = fStack_1204 - fVar68;
          fVar129 = fStack_1200 - fVar68;
          fVar68 = fStack_11fc - fVar68;
          fVar140 = local_1228 - fVar100;
          fVar142 = fStack_1224 - fVar100;
          fVar143 = fStack_1220 - fVar100;
          fVar100 = fStack_121c - fVar100;
          fVar132 = local_1218 - fVar86;
          fVar151 = fStack_1214 - fVar86;
          fVar139 = fStack_1210 - fVar86;
          fVar86 = fStack_120c - fVar86;
          local_1228 = fVar141 - (float)local_12e8._0_4_;
          fStack_1224 = fVar128 - (float)local_12e8._4_4_;
          fStack_1220 = fVar129 - fStack_12e0;
          fStack_121c = fVar68 - fStack_12dc;
          local_10b8 = fVar140 - fVar87;
          fStack_10b4 = fVar142 - fVar98;
          fStack_10b0 = fVar143 - fVar99;
          fStack_10ac = fVar100 - fVar131;
          local_1238 = fVar132 - fVar122;
          fStack_1234 = fVar151 - fVar125;
          fStack_1230 = fVar139 - fVar126;
          fStack_122c = fVar86 - fVar127;
          fVar152 = *(float *)&(This->collider).collide;
          fVar38 = *(float *)((long)&(This->collider).collide + 4);
          fVar66 = *(float *)&(This->collider).name;
          fVar117 = (local_10b8 * (fVar122 + fVar132) - (fVar87 + fVar140) * local_1238) * fVar152 +
                    (((float)local_12e8._0_4_ + fVar141) * local_1238 -
                    (fVar122 + fVar132) * local_1228) * fVar38 +
                    (local_1228 * (fVar87 + fVar140) -
                    ((float)local_12e8._0_4_ + fVar141) * local_10b8) * fVar66;
          fVar138 = (fStack_10b4 * (fVar125 + fVar151) - (fVar98 + fVar142) * fStack_1234) * fVar152
                    + (((float)local_12e8._4_4_ + fVar128) * fStack_1234 -
                      (fVar125 + fVar151) * fStack_1224) * fVar38 +
                      (fStack_1224 * (fVar98 + fVar142) -
                      ((float)local_12e8._4_4_ + fVar128) * fStack_10b4) * fVar66;
          local_11e8._0_8_ = CONCAT44(fVar138,fVar117);
          local_11e8._8_4_ =
               (fStack_10b0 * (fVar126 + fVar139) - (fVar99 + fVar143) * fStack_1230) * fVar152 +
               ((fStack_12e0 + fVar129) * fStack_1230 - (fVar126 + fVar139) * fStack_1220) * fVar38
               + (fStack_1220 * (fVar99 + fVar143) - (fStack_12e0 + fVar129) * fStack_10b0) * fVar66
          ;
          fStack_11dc = (fStack_10ac * (fVar127 + fVar86) - (fVar131 + fVar100) * fStack_122c) *
                        fVar152 + ((fStack_12dc + fVar68) * fStack_122c -
                                  (fVar127 + fVar86) * fStack_121c) * fVar38 +
                                  (fStack_121c * (fVar131 + fVar100) -
                                  (fStack_12dc + fVar68) * fStack_10ac) * fVar66;
          local_1308._0_4_ = (float)local_12e8._0_4_ - fVar106;
          local_1308._4_4_ = (float)local_12e8._4_4_ - fVar119;
          fStack_1300 = fStack_12e0 - fVar120;
          fStack_12fc = fStack_12dc - fVar121;
          local_10c8 = fVar87 - fVar153;
          fStack_10c4 = fVar98 - fVar157;
          fStack_10c0 = fVar99 - fVar149;
          fStack_10bc = fVar131 - fVar166;
          fVar156 = fVar122 - fVar67;
          fVar159 = fVar125 - fVar74;
          fVar163 = fVar126 - fVar84;
          fVar167 = fVar127 - fVar85;
          local_1208 = fVar87;
          fStack_1204 = fVar98;
          fStack_1200 = fVar99;
          fStack_11fc = fVar131;
          local_1218 = fVar122;
          fStack_1214 = fVar125;
          fStack_1210 = fVar126;
          fStack_120c = fVar127;
          local_10d8._0_4_ =
               (local_10c8 * (fVar122 + fVar67) - (fVar87 + fVar153) * fVar156) * fVar152 +
               (((float)local_12e8._0_4_ + fVar106) * fVar156 -
               (fVar122 + fVar67) * (float)local_1308._0_4_) * fVar38 +
               ((float)local_1308._0_4_ * (fVar87 + fVar153) -
               ((float)local_12e8._0_4_ + fVar106) * local_10c8) * fVar66;
          local_10d8._4_4_ =
               (fStack_10c4 * (fVar125 + fVar74) - (fVar98 + fVar157) * fVar159) * fVar152 +
               (((float)local_12e8._4_4_ + fVar119) * fVar159 -
               (fVar125 + fVar74) * (float)local_1308._4_4_) * fVar38 +
               ((float)local_1308._4_4_ * (fVar98 + fVar157) -
               ((float)local_12e8._4_4_ + fVar119) * fStack_10c4) * fVar66;
          fStack_10d0 = (fStack_10c0 * (fVar126 + fVar84) - (fVar99 + fVar149) * fVar163) * fVar152
                        + ((fStack_12e0 + fVar120) * fVar163 - (fVar126 + fVar84) * fStack_1300) *
                          fVar38 + (fStack_1300 * (fVar99 + fVar149) -
                                   (fStack_12e0 + fVar120) * fStack_10c0) * fVar66;
          fStack_10cc = (fStack_10bc * (fVar127 + fVar85) - (fVar131 + fVar166) * fVar167) * fVar152
                        + ((fStack_12dc + fVar121) * fVar167 - (fVar127 + fVar85) * fStack_12fc) *
                          fVar38 + (fStack_12fc * (fVar131 + fVar166) -
                                   (fStack_12dc + fVar121) * fStack_10bc) * fVar66;
          local_1108 = fVar106 - fVar141;
          fStack_1104 = fVar119 - fVar128;
          fStack_1100 = fVar120 - fVar129;
          fStack_10fc = fVar121 - fVar68;
          local_10f8 = fVar153 - fVar140;
          fStack_10f4 = fVar157 - fVar142;
          fStack_10f0 = fVar149 - fVar143;
          fStack_10ec = fVar166 - fVar100;
          fVar144 = fVar67 - fVar132;
          fVar162 = fVar74 - fVar151;
          fStack_1310 = fVar84 - fVar139;
          fStack_130c = fVar85 - fVar86;
          local_1318 = CONCAT44(fVar162,fVar144);
          local_1328 = (byte *)CONCAT44(fVar66,fVar66);
          uStack_1320 = CONCAT44(fVar66,fVar66);
          local_12c8 = CONCAT44(fVar38,fVar38);
          uStack_12c0 = CONCAT44(fVar38,fVar38);
          auVar57._0_4_ =
               (local_10f8 * (fVar132 + fVar67) - (fVar140 + fVar153) * fVar144) * fVar152 +
               ((fVar141 + fVar106) * fVar144 - (fVar132 + fVar67) * local_1108) * fVar38 +
               (local_1108 * (fVar140 + fVar153) - (fVar141 + fVar106) * local_10f8) * fVar66;
          auVar57._4_4_ =
               (fStack_10f4 * (fVar151 + fVar74) - (fVar142 + fVar157) * fVar162) * fVar152 +
               ((fVar128 + fVar119) * fVar162 - (fVar151 + fVar74) * fStack_1104) * fVar38 +
               (fStack_1104 * (fVar142 + fVar157) - (fVar128 + fVar119) * fStack_10f4) * fVar66;
          auVar57._8_4_ =
               (fStack_10f0 * (fVar139 + fVar84) - (fVar143 + fVar149) * fStack_1310) * fVar152 +
               ((fVar129 + fVar120) * fStack_1310 - (fVar139 + fVar84) * fStack_1100) * fVar38 +
               (fStack_1100 * (fVar143 + fVar149) - (fVar129 + fVar120) * fStack_10f0) * fVar66;
          auVar57._12_4_ =
               (fStack_10ec * (fVar86 + fVar85) - (fVar100 + fVar166) * fStack_130c) * fVar152 +
               ((fVar68 + fVar121) * fStack_130c - (fVar86 + fVar85) * fStack_10fc) * fVar38 +
               (fStack_10fc * (fVar100 + fVar166) - (fVar68 + fVar121) * fStack_10ec) * fVar66;
          local_10e8 = (float)local_10d8._0_4_ + fVar117 + auVar57._0_4_;
          fStack_10e4 = (float)local_10d8._4_4_ + fVar138 + auVar57._4_4_;
          fStack_10e0 = fStack_10d0 + (float)local_11e8._8_4_ + auVar57._8_4_;
          fStack_10dc = fStack_10cc + fStack_11dc + auVar57._12_4_;
          auVar81._8_4_ = local_11e8._8_4_;
          auVar81._0_8_ = local_11e8._0_8_;
          auVar81._12_4_ = fStack_11dc;
          auVar134 = minps(auVar81,_local_10d8);
          auVar134 = minps(auVar134,auVar57);
          auVar136._8_4_ = local_11e8._8_4_;
          auVar136._0_8_ = local_11e8._0_8_;
          auVar136._12_4_ = fStack_11dc;
          auVar133 = maxps(auVar136,_local_10d8);
          auVar133 = maxps(auVar133,auVar57);
          fVar68 = ABS(local_10e8) * 1.1920929e-07;
          fVar100 = ABS(fStack_10e4) * 1.1920929e-07;
          fVar86 = ABS(fStack_10e0) * 1.1920929e-07;
          fVar67 = ABS(fStack_10dc) * 1.1920929e-07;
          auVar137._4_4_ = -(uint)(auVar133._4_4_ <= fVar100);
          auVar137._0_4_ = -(uint)(auVar133._0_4_ <= fVar68);
          auVar137._8_4_ = -(uint)(auVar133._8_4_ <= fVar86);
          auVar137._12_4_ = -(uint)(auVar133._12_4_ <= fVar67);
          auVar82._4_4_ = -(uint)(-fVar100 <= auVar134._4_4_);
          auVar82._0_4_ = -(uint)(-fVar68 <= auVar134._0_4_);
          auVar82._8_4_ = -(uint)(-fVar86 <= auVar134._8_4_);
          auVar82._12_4_ = -(uint)(-fVar67 <= auVar134._12_4_);
          auVar137 = auVar137 | auVar82;
          iVar20 = movmskps(uVar19,auVar137);
          if (iVar20 != 0) {
            auVar124._0_4_ = local_10b8 * fVar156 - local_10c8 * local_1238;
            auVar124._4_4_ = fStack_10b4 * fVar159 - fStack_10c4 * fStack_1234;
            auVar124._8_4_ = fStack_10b0 * fVar163 - fStack_10c0 * fStack_1230;
            auVar124._12_4_ = fStack_10ac * fVar167 - fStack_10bc * fStack_122c;
            auVar71._0_4_ = local_10c8 * fVar144 - fVar156 * local_10f8;
            auVar71._4_4_ = fStack_10c4 * fVar162 - fVar159 * fStack_10f4;
            auVar71._8_4_ = fStack_10c0 * fStack_1310 - fVar163 * fStack_10f0;
            auVar71._12_4_ = fStack_10bc * fStack_130c - fVar167 * fStack_10ec;
            auVar58._4_4_ = -(uint)(ABS(fStack_10c4 * fStack_1234) < ABS(fVar159 * fStack_10f4));
            auVar58._0_4_ = -(uint)(ABS(local_10c8 * local_1238) < ABS(fVar156 * local_10f8));
            auVar58._8_4_ = -(uint)(ABS(fStack_10c0 * fStack_1230) < ABS(fVar163 * fStack_10f0));
            auVar58._12_4_ = -(uint)(ABS(fStack_10bc * fStack_122c) < ABS(fVar167 * fStack_10ec));
            local_11b8 = blendvps(auVar71,auVar124,auVar58);
            auVar105._0_4_ = local_1238 * (float)local_1308._0_4_ - fVar156 * local_1228;
            auVar105._4_4_ = fStack_1234 * (float)local_1308._4_4_ - fVar159 * fStack_1224;
            auVar105._8_4_ = fStack_1230 * fStack_1300 - fVar163 * fStack_1220;
            auVar105._12_4_ = fStack_122c * fStack_12fc - fVar167 * fStack_121c;
            auVar148._0_4_ = fVar156 * local_1108 - (float)local_1308._0_4_ * fVar144;
            auVar148._4_4_ = fVar159 * fStack_1104 - (float)local_1308._4_4_ * fVar162;
            auVar148._8_4_ = fVar163 * fStack_1100 - fStack_1300 * fStack_1310;
            auVar148._12_4_ = fVar167 * fStack_10fc - fStack_12fc * fStack_130c;
            auVar59._4_4_ =
                 -(uint)(ABS(fVar159 * fStack_1224) < ABS((float)local_1308._4_4_ * fVar162));
            auVar59._0_4_ =
                 -(uint)(ABS(fVar156 * local_1228) < ABS((float)local_1308._0_4_ * fVar144));
            auVar59._8_4_ = -(uint)(ABS(fVar163 * fStack_1220) < ABS(fStack_1300 * fStack_1310));
            auVar59._12_4_ = -(uint)(ABS(fVar167 * fStack_121c) < ABS(fStack_12fc * fStack_130c));
            local_11a8 = blendvps(auVar148,auVar105,auVar59);
            auVar165._0_4_ = local_1228 * local_10c8 - (float)local_1308._0_4_ * local_10b8;
            auVar165._4_4_ = fStack_1224 * fStack_10c4 - (float)local_1308._4_4_ * fStack_10b4;
            auVar165._8_4_ = fStack_1220 * fStack_10c0 - fStack_1300 * fStack_10b0;
            auVar165._12_4_ = fStack_121c * fStack_10bc - fStack_12fc * fStack_10ac;
            auVar155._0_4_ = (float)local_1308._0_4_ * local_10f8 - local_10c8 * local_1108;
            auVar155._4_4_ = (float)local_1308._4_4_ * fStack_10f4 - fStack_10c4 * fStack_1104;
            auVar155._8_4_ = fStack_1300 * fStack_10f0 - fStack_10c0 * fStack_1100;
            auVar155._12_4_ = fStack_12fc * fStack_10ec - fStack_10bc * fStack_10fc;
            auVar60._4_4_ =
                 -(uint)(ABS((float)local_1308._4_4_ * fStack_10b4) < ABS(fStack_10c4 * fStack_1104)
                        );
            auVar60._0_4_ =
                 -(uint)(ABS((float)local_1308._0_4_ * local_10b8) < ABS(local_10c8 * local_1108));
            auVar60._8_4_ = -(uint)(ABS(fStack_1300 * fStack_10b0) < ABS(fStack_10c0 * fStack_1100))
            ;
            auVar60._12_4_ =
                 -(uint)(ABS(fStack_12fc * fStack_10ac) < ABS(fStack_10bc * fStack_10fc));
            local_1198 = blendvps(auVar155,auVar165,auVar60);
            local_11c8._4_4_ = fStack_10e4;
            local_11c8._0_4_ = local_10e8;
            local_11c8._8_4_ = fStack_10e0;
            local_11c8._12_4_ = fStack_10dc;
            fVar67 = fVar152 * local_11b8._0_4_ +
                     fVar38 * local_11a8._0_4_ + fVar66 * local_1198._0_4_;
            fVar74 = fVar152 * local_11b8._4_4_ +
                     fVar38 * local_11a8._4_4_ + fVar66 * local_1198._4_4_;
            fVar84 = fVar152 * local_11b8._8_4_ +
                     fVar38 * local_11a8._8_4_ + fVar66 * local_1198._8_4_;
            fVar38 = fVar152 * local_11b8._12_4_ +
                     fVar38 * local_11a8._12_4_ + fVar66 * local_1198._12_4_;
            fVar67 = fVar67 + fVar67;
            fVar74 = fVar74 + fVar74;
            fVar84 = fVar84 + fVar84;
            fVar38 = fVar38 + fVar38;
            auVar61._0_4_ = fVar87 * local_11a8._0_4_ + fVar122 * local_1198._0_4_;
            auVar61._4_4_ = fVar98 * local_11a8._4_4_ + fVar125 * local_1198._4_4_;
            auVar61._8_4_ = fVar99 * local_11a8._8_4_ + fVar126 * local_1198._8_4_;
            auVar61._12_4_ = fVar131 * local_11a8._12_4_ + fVar127 * local_1198._12_4_;
            fVar68 = (float)local_12e8._0_4_ * local_11b8._0_4_ + auVar61._0_4_;
            fVar100 = (float)local_12e8._4_4_ * local_11b8._4_4_ + auVar61._4_4_;
            fVar86 = fStack_12e0 * local_11b8._8_4_ + auVar61._8_4_;
            fVar152 = fStack_12dc * local_11b8._12_4_ + auVar61._12_4_;
            auVar116._0_4_ = fVar68 + fVar68;
            auVar116._4_4_ = fVar100 + fVar100;
            auVar116._8_4_ = fVar86 + fVar86;
            auVar116._12_4_ = fVar152 + fVar152;
            auVar14._4_4_ = fVar74;
            auVar14._0_4_ = fVar67;
            auVar14._8_4_ = fVar84;
            auVar14._12_4_ = fVar38;
            auVar134 = rcpps(auVar61,auVar14);
            fVar68 = auVar134._0_4_;
            fVar100 = auVar134._4_4_;
            fVar86 = auVar134._8_4_;
            fVar152 = auVar134._12_4_;
            local_1308._0_4_ = ((1.0 - fVar67 * fVar68) * fVar68 + fVar68) * auVar116._0_4_;
            local_1308._4_4_ = ((1.0 - fVar74 * fVar100) * fVar100 + fVar100) * auVar116._4_4_;
            fStack_1300 = ((1.0 - fVar84 * fVar86) * fVar86 + fVar86) * auVar116._8_4_;
            fStack_12fc = ((1.0 - fVar38 * fVar152) * fVar152 + fVar152) * auVar116._12_4_;
            auVar7._0_8_ = (This->intersector1).intersect;
            auVar7._8_8_ = (This->intersector1).occluded;
            fVar100 = (float)auVar7._0_8_;
            uVar24 = (undefined4)((ulong)auVar7._0_8_ >> 0x20);
            uVar25 = (undefined4)auVar7._8_8_;
            uVar158 = (undefined4)((ulong)auVar7._8_8_ >> 0x20);
            fVar68 = *(float *)((long)&This->leafIntersector + 4);
            local_1188._0_4_ =
                 -(uint)(fVar67 != 0.0) & auVar137._0_4_ &
                 -(uint)((float)local_1308._0_4_ <= fVar100 && fVar68 <= (float)local_1308._0_4_);
            local_1188._4_4_ =
                 -(uint)(fVar74 != 0.0) & auVar137._4_4_ &
                 -(uint)((float)local_1308._4_4_ <= fVar100 && fVar68 <= (float)local_1308._4_4_);
            local_1188._8_4_ =
                 -(uint)(fVar84 != 0.0) & auVar137._8_4_ &
                 -(uint)(fStack_1300 <= fVar100 && fVar68 <= fStack_1300);
            local_1188._12_4_ =
                 -(uint)(fVar38 != 0.0) & auVar137._12_4_ &
                 -(uint)(fStack_12fc <= fVar100 && fVar68 <= fStack_12fc);
            auVar15._4_4_ = local_1188._4_4_;
            auVar15._0_4_ = local_1188._0_4_;
            auVar15._8_4_ = local_1188._8_4_;
            auVar15._12_4_ = local_1188._12_4_;
            iVar20 = movmskps(iVar20,auVar15);
            if (iVar20 != 0) {
              _local_11d8 = _local_10d8;
              _local_1158 = _local_1308;
              local_1118._8_8_ = uStack_1070;
              local_1118._0_8_ = local_1078;
              local_12f8._4_4_ = local_1188._4_4_;
              local_12f8._0_4_ = local_1188._0_4_;
              local_12f8._8_4_ = local_1188._8_4_;
              local_12f8._12_4_ = local_1188._12_4_;
              auVar134 = rcpps(auVar116,local_11c8);
              fVar66 = auVar134._0_4_;
              fVar67 = auVar134._4_4_;
              fVar74 = auVar134._8_4_;
              fVar84 = auVar134._12_4_;
              fVar86 = (float)DAT_01f46a60;
              fVar152 = DAT_01f46a60._4_4_;
              fVar38 = DAT_01f46a60._12_4_;
              fVar68 = DAT_01f46a60._8_4_;
              fVar66 = (float)(-(uint)(1e-18 <= ABS(local_10e8)) &
                              (uint)((fVar86 - local_10e8 * fVar66) * fVar66 + fVar66));
              fVar67 = (float)(-(uint)(1e-18 <= ABS(fStack_10e4)) &
                              (uint)((fVar152 - fStack_10e4 * fVar67) * fVar67 + fVar67));
              fVar74 = (float)(-(uint)(1e-18 <= ABS(fStack_10e0)) &
                              (uint)((fVar68 - fStack_10e0 * fVar74) * fVar74 + fVar74));
              fVar84 = (float)(-(uint)(1e-18 <= ABS(fStack_10dc)) &
                              (uint)((fVar38 - fStack_10dc * fVar84) * fVar84 + fVar84));
              auVar112._0_4_ = fVar117 * fVar66;
              auVar112._4_4_ = fVar138 * fVar67;
              auVar112._8_4_ = (float)local_11e8._8_4_ * fVar74;
              auVar112._12_4_ = fStack_11dc * fVar84;
              auVar134 = minps(auVar112,_DAT_01f46a60);
              auVar161._0_4_ = fVar66 * (float)local_10d8._0_4_;
              auVar161._4_4_ = fVar67 * (float)local_10d8._4_4_;
              auVar161._8_4_ = fVar74 * fStack_10d0;
              auVar161._12_4_ = fVar84 * fStack_10cc;
              auVar133 = minps(auVar161,_DAT_01f46a60);
              auVar83._0_4_ = fVar86 - auVar134._0_4_;
              auVar83._4_4_ = fVar152 - auVar134._4_4_;
              auVar83._8_4_ = fVar68 - auVar134._8_4_;
              auVar83._12_4_ = fVar38 - auVar134._12_4_;
              auVar95._0_4_ = fVar86 - auVar133._0_4_;
              auVar95._4_4_ = fVar152 - auVar133._4_4_;
              auVar95._8_4_ = fVar68 - auVar133._8_4_;
              auVar95._12_4_ = fVar38 - auVar133._12_4_;
              local_1178 = blendvps(auVar134,auVar83,local_1118);
              local_1168 = blendvps(auVar133,auVar95,local_1118);
              local_1148 = local_11b8;
              local_1138 = local_11a8;
              local_1128 = local_1198;
              auVar62._4_4_ = local_1188._4_4_;
              auVar62._0_4_ = local_1188._0_4_;
              auVar62._8_4_ = local_1188._8_4_;
              auVar62._12_4_ = local_1188._12_4_;
              auVar133 = blendvps(_DAT_01f45a30,_local_1308,auVar62);
              auVar96._4_4_ = auVar133._0_4_;
              auVar96._0_4_ = auVar133._4_4_;
              auVar96._8_4_ = auVar133._12_4_;
              auVar96._12_4_ = auVar133._8_4_;
              auVar134 = minps(auVar96,auVar133);
              auVar63._0_8_ = auVar134._8_8_;
              auVar63._8_4_ = auVar134._0_4_;
              auVar63._12_4_ = auVar134._4_4_;
              auVar134 = minps(auVar63,auVar134);
              auVar64._0_4_ = -(uint)(auVar134._0_4_ == auVar133._0_4_) & local_1188._0_4_;
              auVar64._4_4_ = -(uint)(auVar134._4_4_ == auVar133._4_4_) & local_1188._4_4_;
              auVar64._8_4_ = -(uint)(auVar134._8_4_ == auVar133._8_4_) & local_1188._8_4_;
              auVar64._12_4_ = -(uint)(auVar134._12_4_ == auVar133._12_4_) & local_1188._12_4_;
              iVar20 = movmskps(iVar20,auVar64);
              uVar19 = local_1188._0_4_;
              uVar145 = local_1188._4_4_;
              uVar150 = local_1188._8_4_;
              uVar130 = local_1188._12_4_;
              if (iVar20 != 0) {
                uVar19 = auVar64._0_4_;
                uVar145 = auVar64._4_4_;
                uVar150 = auVar64._8_4_;
                uVar130 = auVar64._12_4_;
              }
              uVar23 = extractps(auVar7,1);
              auVar16._4_4_ = uVar145;
              auVar16._0_4_ = uVar19;
              auVar16._8_4_ = uVar150;
              auVar16._12_4_ = uVar130;
              uVar26 = movmskps((int)context,auVar16);
              uVar30 = CONCAT44((int)((ulong)context >> 0x20),uVar26);
              lVar22 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              local_1318 = *(long *)&(ray->super_RayK<1>).org.field_0;
LAB_00693a3f:
              local_1250 = *(uint *)(lVar29 + 0xc0 + lVar22 * 4);
              pbVar28 = (byte *)(ulong)local_1250;
              lVar29 = *(long *)(*(long *)(local_1318 + 0x1e8) + (long)pbVar28 * 8);
              if ((*(uint *)(lVar29 + 0x34) & (uint)uVar23) == 0) {
                *(undefined4 *)(local_12f8 + lVar22 * 4) = 0;
                lVar29 = local_12d8;
              }
              else {
                local_1328 = *(byte **)&(ray->super_RayK<1>).dir.field_0;
                if (*(long *)(local_1328 + 0x10) == 0) {
                  local_1288 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                  if (*(long *)(lVar29 + 0x40) == 0) {
                    uVar24 = *(undefined4 *)(local_1178 + lVar22 * 4);
                    uVar25 = *(undefined4 *)(local_1168 + lVar22 * 4);
                    *(undefined4 *)&(This->intersector1).intersect =
                         *(undefined4 *)(local_1158 + lVar22 * 4);
                    *(undefined4 *)&(This->intersector1).pointQuery =
                         *(undefined4 *)(local_1148 + lVar22 * 4);
                    *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                         *(undefined4 *)(local_1138 + lVar22 * 4);
                    *(undefined4 *)&(This->intersector1).name =
                         *(undefined4 *)(local_1128 + lVar22 * 4);
                    *(undefined4 *)((long)&(This->intersector1).name + 4) = uVar24;
                    *(undefined4 *)&(This->intersector4).intersect = uVar25;
                    *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                         *(undefined4 *)((long)&local_11f8 + lVar22 * 4);
                    *(uint *)&(This->intersector4).occluded = local_1250;
                    context = (RayQueryContext *)(ulong)*local_1288;
                    *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1288;
                    *(uint *)&(This->intersector4).name = local_1288[1];
                    uVar30 = local_12a0;
                    goto LAB_00693d9f;
                  }
                }
                else {
                  local_1288 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                }
                local_12e8._4_4_ = uVar24;
                local_12e8._0_4_ = fVar100;
                fStack_12e0 = (float)uVar25;
                fStack_12dc = (float)uVar158;
                local_1268 = *(float *)(local_1148 + lVar22 * 4);
                local_1264 = *(undefined4 *)(local_1138 + lVar22 * 4);
                local_1260 = *(undefined4 *)(local_1128 + lVar22 * 4);
                local_125c = *(undefined4 *)(local_1178 + lVar22 * 4);
                local_1258 = *(undefined4 *)(local_1168 + lVar22 * 4);
                local_1254 = *(undefined4 *)((long)&local_11f8 + lVar22 * 4);
                local_124c = *local_1288;
                local_1248 = local_1288[1];
                *(undefined4 *)&(This->intersector1).intersect =
                     *(undefined4 *)(local_1158 + lVar22 * 4);
                local_132c = -1;
                local_1298 = &local_132c;
                pbVar28 = *(byte **)(lVar29 + 0x18);
                local_1290 = pbVar28;
                local_1280 = This;
                local_1278 = &local_1268;
                local_1270 = 1;
                if (((*(code **)(lVar29 + 0x40) == (code *)0x0) ||
                    (local_12c8 = lVar31, (**(code **)(lVar29 + 0x40))(&local_1298),
                    This = local_12b0, lVar31 = local_12c8, ray = local_12a8, uVar34 = local_12b8,
                    *local_1298 != 0)) &&
                   ((*(code **)(local_1328 + 0x10) == (code *)0x0 ||
                    ((((*local_1328 & 2) == 0 && ((*(byte *)(lVar29 + 0x3e) & 0x40) == 0)) ||
                     ((**(code **)(local_1328 + 0x10))(&local_1298), pbVar28 = local_1328,
                     This = local_12b0, ray = local_12a8, uVar34 = local_12b8, *local_1298 != 0)))))
                   ) {
                  *(float *)&(local_1280->intersector1).pointQuery = *local_1278;
                  *(float *)((long)&(local_1280->intersector1).pointQuery + 4) = local_1278[1];
                  *(float *)&(local_1280->intersector1).name = local_1278[2];
                  *(float *)((long)&(local_1280->intersector1).name + 4) = local_1278[3];
                  *(float *)&(local_1280->intersector4).intersect = local_1278[4];
                  *(float *)((long)&(local_1280->intersector4).intersect + 4) = local_1278[5];
                  *(float *)&(local_1280->intersector4).occluded = local_1278[6];
                  *(float *)((long)&(local_1280->intersector4).occluded + 4) = local_1278[7];
                  pbVar28 = (byte *)(ulong)(uint)local_1278[8];
                  *(float *)&(local_1280->intersector4).name = local_1278[8];
                }
                else {
                  *(undefined4 *)&(local_12b0->intersector1).intersect = local_12e8._0_4_;
                  This = local_12b0;
                  ray = local_12a8;
                  uVar34 = local_12b8;
                }
                lVar29 = local_12d8;
                *(undefined4 *)(local_12f8 + lVar22 * 4) = 0;
                auVar8._0_8_ = (This->intersector1).intersect;
                auVar8._8_8_ = (This->intersector1).occluded;
                fVar100 = (float)auVar8._0_8_;
                uVar24 = (undefined4)((ulong)auVar8._0_8_ >> 0x20);
                uVar25 = (undefined4)auVar8._8_8_;
                uVar158 = (undefined4)((ulong)auVar8._8_8_ >> 0x20);
                local_12f8._0_4_ = -(uint)(local_1308._0_4_ <= fVar100) & local_12f8._0_4_;
                local_12f8._4_4_ = -(uint)(local_1308._4_4_ <= fVar100) & local_12f8._4_4_;
                local_12f8._8_4_ = -(uint)(local_1308._8_4_ <= fVar100) & local_12f8._8_4_;
                local_12f8._12_4_ = -(uint)(local_1308._12_4_ <= fVar100) & local_12f8._12_4_;
                uVar23 = extractps(auVar8,1);
              }
              uVar26 = (undefined4)((ulong)pbVar28 >> 0x20);
              iVar20 = movmskps((int)pbVar28,local_12f8);
              context = (RayQueryContext *)CONCAT44(uVar26,iVar20);
              uVar30 = local_12a0;
              if (iVar20 == 0) goto LAB_00693d9f;
              auVar133 = blendvps(_DAT_01f45a30,_local_1308,local_12f8);
              auVar97._4_4_ = auVar133._0_4_;
              auVar97._0_4_ = auVar133._4_4_;
              auVar97._8_4_ = auVar133._12_4_;
              auVar97._12_4_ = auVar133._8_4_;
              auVar134 = minps(auVar97,auVar133);
              auVar72._0_8_ = auVar134._8_8_;
              auVar72._8_4_ = auVar134._0_4_;
              auVar72._12_4_ = auVar134._4_4_;
              auVar134 = minps(auVar72,auVar134);
              auVar73._0_8_ =
                   CONCAT44(-(uint)(auVar134._4_4_ == auVar133._4_4_) & local_12f8._4_4_,
                            -(uint)(auVar134._0_4_ == auVar133._0_4_) & local_12f8._0_4_);
              auVar73._8_4_ = -(uint)(auVar134._8_4_ == auVar133._8_4_) & local_12f8._8_4_;
              auVar73._12_4_ = -(uint)(auVar134._12_4_ == auVar133._12_4_) & local_12f8._12_4_;
              iVar20 = movmskps(iVar20,auVar73);
              auVar65 = local_12f8;
              if (iVar20 != 0) {
                auVar65._8_4_ = auVar73._8_4_;
                auVar65._0_8_ = auVar73._0_8_;
                auVar65._12_4_ = auVar73._12_4_;
              }
              uVar27 = movmskps(iVar20,auVar65);
              uVar30 = CONCAT44(uVar26,uVar27);
              lVar22 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              goto LAB_00693a3f;
            }
          }
LAB_00693d9f:
          fVar68 = local_ff8;
          fVar100 = fStack_ff4;
          fVar66 = fStack_ff0;
          fVar67 = fStack_fec;
          fVar152 = local_1038;
          fVar74 = fStack_1034;
          fVar84 = fStack_1030;
          fVar85 = fStack_102c;
          fVar131 = local_1088;
          fVar87 = fStack_1084;
          fVar98 = fStack_1080;
          fVar99 = fStack_107c;
          fVar138 = local_1098;
          fVar106 = fStack_1094;
          fVar117 = fStack_1090;
          fVar119 = fStack_108c;
          fVar38 = local_fe8;
          fVar120 = fStack_fe4;
          fVar121 = fStack_fe0;
          fVar122 = fStack_fdc;
          fVar141 = local_1008;
          fVar125 = fStack_1004;
          fVar126 = fStack_1000;
          fVar127 = fStack_ffc;
          fVar151 = local_1018;
          fVar128 = fStack_1014;
          fVar129 = fStack_1010;
          fVar132 = fStack_100c;
          fVar86 = local_1028;
          fVar139 = fStack_1024;
          fVar140 = fStack_1020;
          fVar142 = fStack_101c;
          fVar144 = local_1048;
          fVar143 = fStack_1044;
          fVar153 = fStack_1040;
          fVar156 = fStack_103c;
          fVar149 = local_1058;
          fVar157 = fStack_1054;
          fVar159 = fStack_1050;
          fVar162 = fStack_104c;
        }
        uVar24 = *(undefined4 *)&(This->intersector1).intersect;
        auVar133._4_4_ = uVar24;
        auVar133._0_4_ = uVar24;
        auVar133._8_4_ = uVar24;
        auVar133._12_4_ = uVar24;
      }
      goto LAB_0069289c;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }